

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseOpeningXMLElement
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  ulong *puVar4;
  int lenght;
  int lenght_00;
  ulong *c;
  string<unsigned_long> s;
  SAttribute local_88;
  string<unsigned_long> local_68;
  ulong *local_58;
  unsigned_long *local_50;
  array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute> *local_48;
  IIrrXMLReader<unsigned_long,_irr::io::IXMLBase> local_40;
  
  this->CurrentNodeType = EXN_ELEMENT;
  this->IsEmptyElement = false;
  local_48 = &this->Attributes;
  core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::clear
            (local_48);
  local_50 = this->P;
  puVar4 = local_50;
  while ((uVar2 = *puVar4, 0x3e < uVar2 ||
         (local_58 = puVar4, (0x4000000100002600U >> (uVar2 & 0x3f) & 1) == 0))) {
    puVar4 = puVar4 + 1;
    this->P = puVar4;
  }
  do {
    if (uVar2 < 0x3f) {
      if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 == 0x2f) {
          this->P = puVar4 + 1;
          this->IsEmptyElement = true;
LAB_006d8554:
          puVar4 = local_58;
          if ((local_50 < local_58) && (local_58[-1] == 0x2f)) {
            puVar4 = local_58 + -1;
            this->IsEmptyElement = true;
          }
          core::string<unsigned_long>::string<unsigned_long>
                    (&local_88.Name,local_50,(s32)((ulong)((long)puVar4 - (long)local_50) >> 3));
          core::string<unsigned_long>::operator=(&this->NodeName,&local_88.Name);
          if (local_88.Name.array != (unsigned_long *)0x0) {
            operator_delete__(local_88.Name.array);
          }
          this->P = this->P + 1;
          return;
        }
        if (uVar2 == 0x3e) goto LAB_006d8554;
        goto LAB_006d83c0;
      }
      puVar4 = puVar4 + 1;
      this->P = puVar4;
    }
    else {
LAB_006d83c0:
      lenght_00 = 0;
      c = puVar4;
      while ((c = c + 1, 0x3d < uVar2 || ((0x2000000100002600U >> (uVar2 & 0x3f) & 1) == 0))) {
        this->P = c;
        lenght_00 = lenght_00 + 1;
        uVar2 = *c;
      }
      do {
        this->P = c;
        uVar2 = *c;
        if (uVar2 == 0) {
          return;
        }
        c = c + 1;
      } while ((uVar2 != 0x27) && (uVar2 != 0x22));
      lenght = -1;
      puVar3 = c;
      do {
        this->P = puVar3;
        uVar1 = *puVar3;
        puVar3 = puVar3 + 1;
        lenght = lenght + 1;
        if (uVar1 == uVar2) break;
      } while (uVar1 != 0);
      if (uVar1 == 0) {
        return;
      }
      this->P = puVar3;
      local_88.Name.allocated = 1;
      local_88.Name.used = 1;
      local_88.Name.array = (unsigned_long *)operator_new__(8);
      *local_88.Name.array = 0;
      local_88.Value.array = (unsigned_long *)0x0;
      local_88.Value.allocated = 1;
      local_88.Value.used = 1;
      local_88.Value.array = (unsigned_long *)operator_new__(8);
      *local_88.Value.array = 0;
      core::string<unsigned_long>::string<unsigned_long>(&local_68,puVar4,lenght_00);
      core::string<unsigned_long>::operator=(&local_88.Name,&local_68);
      if (local_68.array != (unsigned_long *)0x0) {
        operator_delete__(local_68.array);
      }
      core::string<unsigned_long>::string<unsigned_long>(&local_68,c,lenght);
      replaceSpecialCharacters
                ((CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)&stack0xffffffffffffffc0,
                 (string<unsigned_long> *)this);
      core::string<unsigned_long>::operator=
                (&local_88.Value,(string<unsigned_long> *)&stack0xffffffffffffffc0);
      if (local_40._vptr_IIrrXMLReader != (_func_int **)0x0) {
        operator_delete__(local_40._vptr_IIrrXMLReader);
      }
      core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::push_back
                (local_48,&local_88);
      if (local_68.array != (unsigned_long *)0x0) {
        operator_delete__(local_68.array);
      }
      if (local_88.Value.array != (unsigned_long *)0x0) {
        operator_delete__(local_88.Value.array);
      }
      if (local_88.Name.array != (unsigned_long *)0x0) {
        operator_delete__(local_88.Name.array);
      }
      puVar4 = this->P;
    }
    uVar2 = *puVar4;
  } while( true );
}

Assistant:

void parseOpeningXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT;
		IsEmptyElement = false;
		Attributes.clear();

		// find name
		const char_type* startName = P;

		// find end of element
		while(*P != L'>' && !isWhiteSpace(*P))
			++P;

		const char_type* endName = P;

		// find Attributes
		while(*P != L'>')
		{
			if (isWhiteSpace(*P))
				++P;
			else
			{
				if (*P != L'/')
				{
					// we've got an attribute

					// read the attribute names
					const char_type* attributeNameBegin = P;

					while(!isWhiteSpace(*P) && *P != L'=')
						++P;

					const char_type* attributeNameEnd = P;
					++P;

					// read the attribute value
					// check for quotes and single quotes, thx to murphy
					while( (*P != L'\"') && (*P != L'\'') && *P) 
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type attributeQuoteChar = *P;

					++P;
					const char_type* attributeValueBegin = P;
					
					while(*P != attributeQuoteChar && *P)
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type* attributeValueEnd = P;
					++P;

					SAttribute attr;
					attr.Name = core::string<char_type>(attributeNameBegin, 
						(int)(attributeNameEnd - attributeNameBegin));

					core::string<char_type> s(attributeValueBegin, 
						(int)(attributeValueEnd - attributeValueBegin));

					attr.Value = replaceSpecialCharacters(s);
					Attributes.push_back(attr);
				}
				else
				{
					// tag is closed directly
					++P;
					IsEmptyElement = true;
					break;
				}
			}
		}

		// check if this tag is closing directly
		if (endName > startName && *(endName-1) == L'/')
		{
			// directly closing tag
			IsEmptyElement = true;
			endName--;
		}
		
		NodeName = core::string<char_type>(startName, (int)(endName - startName));

		++P;
	}